

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transitions.hpp
# Opt level: O3

event_process_result __thiscall
afsm::transitions::
state_transition_table<afsm::inner_state_machine<afsm::test::connection_pri_fsm_def::transaction::extended_query,_afsm::inner_state_machine<afsm::test::connection_pri_fsm_def::transaction,_afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_afsm::test::connection_pri_fsm_def::transaction::extended_query,_unsigned_long>
::process_transition_event<afsm::test::events::command_complete>
          (state_transition_table<afsm::inner_state_machine<afsm::test::connection_pri_fsm_def::transaction::extended_query,_afsm::inner_state_machine<afsm::test::connection_pri_fsm_def::transaction,_afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_afsm::test::connection_pri_fsm_def::transaction::extended_query,_unsigned_long>
           *this,command_complete *event)

{
  event_process_result eVar1;
  transition_table_type<afsm::test::events::command_complete> *ptVar2;
  indexes_tuple<0UL,_1UL,_2UL,_3UL> local_11;
  
  ptVar2 = state_transition_table<afsm::inner_state_machine<afsm::test::connection_pri_fsm_def::transaction::extended_query,afsm::inner_state_machine<afsm::test::connection_pri_fsm_def::transaction,afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>>,afsm::test::connection_pri_fsm_def::transaction::extended_query,unsigned_long>
           ::transition_table<afsm::test::events::command_complete,0ul,1ul,2ul,3ul>(&local_11);
  if (ptVar2->_M_elems[this->current_state_].super__Function_base._M_manager != (_Manager_type)0x0)
  {
    eVar1 = (**(code **)(((_Any_data *)(ptVar2->_M_elems + this->current_state_))->_M_pod_data +
                        0x18))((_Any_data *)(ptVar2->_M_elems + this->current_state_),this,event);
    return eVar1;
  }
  std::__throw_bad_function_call();
}

Assistant:

actions::event_process_result
    process_transition_event(Event&& event)
    {
        auto const& inv_table = transition_table<Event>( state_indexes{} );
        return inv_table[current_state()](*this, ::std::forward<Event>(event));
    }